

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O0

void __thiscall QPDFWriter::writeHeader(QPDFWriter *this)

{
  element_type *peVar1;
  string_view local_60;
  string_view local_50;
  string_view local_40;
  string_view local_30;
  string_view local_20;
  QPDFWriter *local_10;
  QPDFWriter *this_local;
  
  local_10 = this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_20,"%PDF-");
  writeString(this,local_20);
  peVar1 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  local_30 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view
                       ((string *)&peVar1->final_pdf_version);
  writeString(this,local_30);
  peVar1 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  if ((peVar1->pclm & 1U) == 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_50,anon_var_dwarf_49370d);
    writeString(this,local_50);
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_40,"\n%PCLm 1.0\n");
    writeString(this,local_40);
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_60,"%QDF-1.0\n\n")
  ;
  writeStringQDF(this,local_60);
  return;
}

Assistant:

void
QPDFWriter::writeHeader()
{
    writeString("%PDF-");
    writeString(m->final_pdf_version);
    if (m->pclm) {
        // PCLm version
        writeString("\n%PCLm 1.0\n");
    } else {
        // This string of binary characters would not be valid UTF-8, so it really should be treated
        // as binary.
        writeString("\n%\xbf\xf7\xa2\xfe\n");
    }
    writeStringQDF("%QDF-1.0\n\n");

    // Note: do not write extra header text here.  Linearized PDFs must include the entire
    // linearization parameter dictionary within the first 1024 characters of the PDF file, so for
    // linearized files, we have to write extra header text after the linearization parameter
    // dictionary.
}